

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

string * __thiscall
helics::NetworkCommsInterface::getAddress_abi_cxx11_
          (string *__return_storage_ptr__,NetworkCommsInterface *this)

{
  string *this_00;
  pointer pcVar1;
  int iVar2;
  string local_60;
  string local_40;
  
  if (((this->PortNumber).super___atomic_base<int>._M_i < 0) &&
     ((this->super_CommsInterface).serverMode == false)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->super_CommsInterface).name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->super_CommsInterface).name._M_string_length);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = &(this->super_CommsInterface).localTargetAddress;
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  "tcp://*");
  if ((iVar2 == 0) ||
     (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      "tcp://0.0.0.0"), iVar2 == 0)) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"tcp://127.0.0.1","");
    gmlc::networking::makePortAddress
              (&local_40,&local_60,(this->PortNumber).super___atomic_base<int>._M_i);
    getAddress_abi_cxx11_();
  }
  else {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,"*"
                   );
    if ((iVar2 == 0) ||
       (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,"0.0.0.0"), iVar2 == 0)) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"127.0.0.1","");
      gmlc::networking::makePortAddress
                (&local_40,&local_60,(this->PortNumber).super___atomic_base<int>._M_i);
      getAddress_abi_cxx11_();
    }
    else {
      gmlc::networking::makePortAddress
                (&local_40,this_00,(this->PortNumber).super___atomic_base<int>._M_i);
      getAddress_abi_cxx11_();
    }
  }
  if (this->appendNameToAddress == true) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'/');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(this->super_CommsInterface).name._M_dataplus._M_p,
               (this->super_CommsInterface).name._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NetworkCommsInterface::getAddress() const
{
    using gmlc::networking::makePortAddress;

    if ((PortNumber < 0) && (!serverMode)) {
        return name;
    }
    std::string address;
    if ((localTargetAddress == "tcp://*") || (localTargetAddress == "tcp://0.0.0.0")) {
        address = makePortAddress("tcp://127.0.0.1", PortNumber);
    } else if ((localTargetAddress == "*") || (localTargetAddress == "0.0.0.0")) {
        address = makePortAddress("127.0.0.1", PortNumber);
    } else {
        address = makePortAddress(localTargetAddress, PortNumber);
    }
    if (appendNameToAddress) {
        address.push_back('/');
        address.append(name);
    }
    return address;
}